

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O0

int q_dgram_read(BIO *bio,char *dst,int bytesToRead)

{
  bool bVar1;
  void *pvVar2;
  qsizetype qVar3;
  Promoted<long_long,_int> PVar4;
  char *__src;
  int in_EDX;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int bytesRead;
  DtlsState *dtls;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QMessageLogger *in_stack_ffffffffffffff80;
  int local_64;
  undefined1 local_60 [24];
  qsizetype local_48;
  char local_40 [36];
  int local_1c;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI == 0) || (in_RSI == (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x0)) ||
     (in_EDX < 1)) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcTlsBackend();
    anon_unknown.dwarf_19fec1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_ffffffffffffff70,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_19fec1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x17bc58);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff80,
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (char *)0x17bc6e);
      QMessageLogger::warning(local_40,"invalid input parameter(s)");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    local_64 = 0;
  }
  else {
    q_BIO_clear_flags((BIO *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    pvVar2 = q_BIO_get_ex_data((BIO *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               0);
    qVar3 = QByteArray::size((QByteArray *)((long)pvVar2 + 0x30));
    if (qVar3 == 0) {
      local_64 = -1;
      in_RSI = in_stack_ffffffffffffff70;
    }
    else {
      local_48 = QByteArray::size((QByteArray *)((long)pvVar2 + 0x30));
      PVar4 = qMin<long_long,int>(&local_48,&local_1c);
      local_64 = (int)PVar4;
      __src = QByteArray::constData((QByteArray *)0x17bd16);
      memcpy(in_RSI,__src,(long)local_64);
      if (*(long *)((long)pvVar2 + 0x70) == 0) {
        QByteArray::mid((longlong)local_60,(long)pvVar2 + 0x30);
        QByteArray::operator=
                  ((QByteArray *)in_RSI,
                   (QByteArray *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        QByteArray::~QByteArray((QByteArray *)0x17bd70);
      }
    }
    if (local_64 < 1) {
      q_BIO_set_flags((BIO *)in_RSI,in_stack_ffffffffffffff6c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_64;
}

Assistant:

int q_dgram_read(BIO *bio, char *dst, int bytesToRead)
{
    if (!bio || !dst || bytesToRead <= 0) {
        qCWarning(lcTlsBackend, "invalid input parameter(s)");
        return 0;
    }

    q_BIO_clear_retry_flags(bio);

    auto dtls = static_cast<dtlsopenssl::DtlsState *>(q_BIO_get_app_data(bio));
    // It's us who set data, if OpenSSL does too, the logic here is wrong
    // then and we have to use BIO_set_app_data then!
    Q_ASSERT(dtls);
    int bytesRead = 0;
    if (dtls->dgram.size()) {
        bytesRead = qMin(dtls->dgram.size(), bytesToRead);
        std::memcpy(dst, dtls->dgram.constData(), bytesRead);

        if (!dtls->peeking)
            dtls->dgram = dtls->dgram.mid(bytesRead);
    } else {
        bytesRead = -1;
    }

    if (bytesRead <= 0)
        q_BIO_set_retry_read(bio);

    return bytesRead;
}